

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson_dist.hpp
# Opt level: O2

void __thiscall trng::poisson_dist::param_type::calc_probabilities(param_type *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  double x;
  uint uVar1;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  this_00 = &this->P_;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(this_00,&local_38);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  uVar1 = 1;
  while( true ) {
    x = this->mu_;
    if ((6 < uVar1 - 1) && (x + x <= (double)(int)(uVar1 - 1))) break;
    local_38._M_impl.super__Vector_impl_data._M_start =
         (pointer)math::detail::GammaQ<double,true>((double)uVar1,x);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_38);
    uVar1 = uVar1 + 1;
  }
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,(double *)&local_38);
  return;
}

Assistant:

void calc_probabilities() {
        P_ = std::vector<double>();
        int x = 0;
        while (x < 7 or x < 2 * mu_) {
          P_.push_back(math::GammaQ(x + 1.0, mu_));
          ++x;
        }
        P_.push_back(1);
      }